

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_formatter.cpp
# Opt level: O0

string * lwlog::details::alignment_formatter::align_right
                   (string *__return_storage_ptr__,string *to_align,uint8_t width,char fill_char)

{
  char cVar1;
  ulong uVar2;
  char fill_char_local;
  uint8_t width_local;
  string *to_align_local;
  string *result;
  
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < width) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    cVar1 = std::__cxx11::string::size();
    std::__cxx11::string::append((ulong)__return_storage_ptr__,width - cVar1);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)to_align);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string alignment_formatter::align_right(const std::string& to_align, std::uint8_t width, char fill_char)
	{
		if (width <= to_align.size()) return to_align;

		std::string result;
		result.reserve(width);

		result.append(width - to_align.size(), fill_char);
		result.append(to_align);

		return result;
	}